

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

double __thiscall DynamicHistogram<double>::order(DynamicHistogram<double> *this,int kth)

{
  uint uVar1;
  runtime_error *this_00;
  double *pdVar2;
  size_type sVar3;
  reference pvVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double slope;
  int i;
  int numBins;
  vector<double,_std::allocator<double>_> dist;
  double local_50;
  double local_48;
  double probability;
  double numItems;
  double estimate;
  int local_1c;
  DynamicHistogram<double> *pDStack_18;
  int kth_local;
  DynamicHistogram<double> *this_local;
  
  local_1c = kth;
  pDStack_18 = this;
  uVar1 = (*this->_vptr_DynamicHistogram[2])();
  if ((uVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"DynamicHistogram::order - Histogram could not be initialized.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  numItems = bin(this,0);
  probability = total(this);
  local_48 = (double)local_1c / probability;
  local_50 = 0.0;
  pdVar2 = std::max<double>(&local_50,&local_48);
  local_48 = *pdVar2;
  dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3ff0000000000000;
  pdVar2 = std::min<double>((double *)
                            &dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,&local_48);
  local_48 = *pdVar2;
  cdf((vector<double,_std::allocator<double>_> *)&i,this);
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)&i);
  slope._0_4_ = 0;
  do {
    if ((int)sVar3 + -1 <= slope._0_4_) {
LAB_001aaedb:
      this_local = (DynamicHistogram<double> *)numItems;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)&i);
      return (double)this_local;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)&i,(long)(slope._0_4_ + 1));
    if ((((*pvVar4 != 0.0) || (NAN(*pvVar4))) &&
        (pvVar4 = std::vector<double,_std::allocator<double>_>::at
                            ((vector<double,_std::allocator<double>_> *)&i,(long)slope._0_4_),
        dVar5 = local_48, *pvVar4 <= local_48)) &&
       (pvVar4 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)&i,(long)(slope._0_4_ + 1)),
       dVar5 <= *pvVar4)) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&i,(long)(slope._0_4_ + 1));
      dVar5 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::at
                         ((vector<double,_std::allocator<double>_> *)&i,(long)slope._0_4_);
      if ((dVar5 != *pvVar4) || (NAN(dVar5) || NAN(*pvVar4))) {
        dVar8 = bin(this,slope._0_4_ + 1);
        dVar9 = bin(this,slope._0_4_);
        pvVar4 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)&i,(long)(slope._0_4_ + 1));
        dVar5 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)&i,(long)slope._0_4_);
        dVar6 = *pvVar4;
        dVar10 = bin(this,slope._0_4_);
        dVar7 = local_48;
        pvVar4 = std::vector<double,_std::allocator<double>_>::at
                           ((vector<double,_std::allocator<double>_> *)&i,(long)slope._0_4_);
        numItems = ((dVar8 - dVar9) / (dVar5 - dVar6)) * (dVar7 - *pvVar4) + dVar10;
      }
      else {
        dVar5 = bin(this,slope._0_4_);
        dVar6 = bin(this,slope._0_4_ + 1);
        dVar7 = bin(this,slope._0_4_);
        numItems = (dVar6 - dVar7) * 0.5 + dVar5;
      }
      goto LAB_001aaedb;
    }
    slope._0_4_ = slope._0_4_ + 1;
  } while( true );
}

Assistant:

double
    order(int kth)
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::order - Histogram could not be initialized.");

        // Estimate of the k'th order statistic
        double estimate = this->bin(0);

        // Compute order's probability and clip at [0,1]
        double numItems = this->total();
        double probability = (double) (kth) / numItems;
        probability = std::max<double>(0, probability);
        probability = std::min<double>(1, probability);

        // Look up probability in cdf
        std::vector<double> dist = this->cdf();
        int numBins = dist.size();
        for (int i = 0; i < numBins-1; i++)
        {
            if (dist.at(i+1) == 0) continue;
            if ((dist.at(i) <= probability) && (probability <= dist.at(i+1)))
            {
                if (dist.at(i+1) == dist.at(i))
                {
                    // If flat cdf avoid divide-by-zero
                    estimate = this->bin(i) + 0.5 * (this->bin(i+1) - this->bin(i));
                }
                else
                {
                    // Linearly interpolate between enclosing bins
                    double slope = (this->bin(i+1) - this->bin(i)) / (dist.at(i+1) - dist.at(i));
                    estimate = this->bin(i) + slope * (probability - dist.at(i));
                }
                return estimate;
            }
        }

        return estimate;

    }